

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O0

bool P_CheckKeys(AActor *owner,int keynum,bool remote)

{
  bool bVar1;
  int iVar2;
  AActor *pAVar3;
  FString *local_58;
  FSoundID local_4c;
  FSoundID local_48;
  int local_44;
  int local_40;
  int snd;
  int i;
  FSoundID failage [2];
  int numfailsounds;
  FSoundID *failsound;
  char *failtext;
  bool remote_local;
  int keynum_local;
  AActor *owner_local;
  
  if (owner == (AActor *)0x0) {
    owner_local._7_1_ = false;
  }
  else if ((keynum < 1) || (0xff < keynum)) {
    owner_local._7_1_ = true;
  }
  else {
    if (!keysdone) {
      P_InitKeyMessages();
    }
    FSoundID::FSoundID((FSoundID *)&snd,"*keytry");
    FSoundID::FSoundID((FSoundID *)&i,"misc/keytry");
    if (locks[keynum] == (Lock *)0x0) {
      if ((keynum == 0x67) && ((gameinfo.flags & 2U) != 0)) {
        failsound = (FSoundID *)anon_var_dwarf_62b57f;
      }
      else {
        failsound = (FSoundID *)anon_var_dwarf_62b596;
      }
      unique0x00004780 = (FSoundID *)&snd;
      failage[0].ID = 2;
    }
    else {
      bVar1 = Lock::check(locks[keynum],owner);
      if (bVar1) {
        return true;
      }
      if (remote) {
        local_58 = &locks[keynum]->RemoteMsg;
      }
      else {
        local_58 = &locks[keynum]->Message;
      }
      failsound = (FSoundID *)FString::operator_cast_to_char_(local_58);
      register0x00000000 = TArray<FSoundID,_FSoundID>::operator[](&locks[keynum]->locksound,0);
      failage[0].ID = TArray<FSoundID,_FSoundID>::Size(&locks[keynum]->locksound);
    }
    pAVar3 = TObjPtr::operator_cast_to_AActor_
                       ((TObjPtr *)(&DAT_00d635d8 + (long)consoleplayer * 0x2a0));
    if (owner == pAVar3) {
      PrintMessage((char *)failsound);
      for (local_40 = 0; local_40 < failage[0].ID; local_40 = local_40 + 1) {
        iVar2 = FSoundID::operator_cast_to_int(stack0xffffffffffffffd0 + local_40);
        if (iVar2 != 0) {
          FSoundID::FSoundID(&local_48,stack0xffffffffffffffd0 + local_40);
          local_44 = S_FindSkinnedSound(owner,&local_48);
          if (local_44 != 0) {
            FSoundID::FSoundID(&local_4c,local_44);
            S_Sound(owner,2,&local_4c,1.0,1.0);
            break;
          }
          local_44 = 0;
        }
      }
    }
    owner_local._7_1_ = false;
  }
  return owner_local._7_1_;
}

Assistant:

bool P_CheckKeys (AActor *owner, int keynum, bool remote)
{
	const char *failtext = NULL;
	FSoundID *failsound;
	int numfailsounds;

	if (owner == NULL) return false;
	if (keynum<=0 || keynum>255) return true;
	// Just a safety precaution. The messages should have been initialized upon game start.
	if (!keysdone) P_InitKeyMessages();

	FSoundID failage[2] = { "*keytry", "misc/keytry" };

	if (!locks[keynum]) 
	{
		if (keynum == 103 && (gameinfo.flags & GI_SHAREWARE))
			failtext = "$TXT_RETAIL_ONLY";
		else
			failtext = "$TXT_DOES_NOT_WORK";

		failsound = failage;
		numfailsounds = countof(failage);
	}
	else
	{
		if (locks[keynum]->check(owner)) return true;
		failtext = remote? locks[keynum]->RemoteMsg : locks[keynum]->Message;
		failsound = &locks[keynum]->locksound[0];
		numfailsounds = locks[keynum]->locksound.Size();
	}

	// If we get here, that means the actor isn't holding an appropriate key.

	if (owner == players[consoleplayer].camera)
	{
		PrintMessage(failtext);

		// Play the first defined key sound.
		for (int i = 0; i < numfailsounds; ++i)
		{
			if (failsound[i] != 0)
			{
				int snd = S_FindSkinnedSound(owner, failsound[i]);
				if (snd != 0)
				{
					S_Sound (owner, CHAN_VOICE, snd, 1, ATTN_NORM);
					break;
				}
			}
		}
	}

	return false;
}